

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O0

bool __thiscall server::ctfservmode::addflag(ctfservmode *this,int i,vec *o,int team,int invistime)

{
  int iVar1;
  flag *this_00;
  flag *f;
  int invistime_local;
  int team_local;
  vec *o_local;
  int i_local;
  ctfservmode *this_local;
  
  if ((i < 0) || (0x13 < i)) {
    this_local._7_1_ = false;
  }
  else {
    while (iVar1 = vector<server::ctfservmode::flag>::length(&this->flags), iVar1 <= i) {
      vector<server::ctfservmode::flag>::add(&this->flags);
    }
    this_00 = vector<server::ctfservmode::flag>::operator[](&this->flags,i);
    this_00->id = i;
    flag::reset(this_00);
    this_00->team = team;
    *(undefined8 *)&(this_00->spawnloc).field_0 = *(undefined8 *)&o->field_0;
    (this_00->spawnloc).field_0.field_0.z = (o->field_0).field_0.z;
    this_00->invistime = invistime;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool addflag(int i, const vec &o, int team, int vistime = -1000)
#endif
    {
        if(i<0 || i>=MAXFLAGS) return false;
        while(flags.length()<=i) flags.add();
        flag &f = flags[i];
        f.id = i;
        f.reset();
        f.team = team;
        f.spawnloc = o;
#ifdef SERVMODE
        f.invistime = invistime;
#else
        f.vistime = vistime;
#endif
        return true;
    }